

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

FirstMatchAssertionExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::FirstMatchAssertionExpr,slang::ast::AssertionExpr_const&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>&>
          (BumpAllocator *this,AssertionExpr *args,
          span<const_slang::ast::Expression_*const,_18446744073709551615UL> *args_1)

{
  FirstMatchAssertionExpr *this_00;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RDX;
  AssertionExpr *in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  this_00 = (FirstMatchAssertionExpr *)
            allocate((BumpAllocator *)in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  ast::FirstMatchAssertionExpr::FirstMatchAssertionExpr(this_00,in_stack_ffffffffffffffc8,*in_RDX);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }